

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O3

int psort_(double *a,int n,int *ind,int ni)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  int local_14c [3];
  int il [16];
  int iu [16];
  int indl [16];
  int indu [16];
  
  uVar8 = (ulong)(uint)n;
  if (((ni | n) < 0) || (ni == 0 || n < 2)) {
    return 0;
  }
  iu[0xe] = 1;
  indl[0xe] = ni;
  iVar18 = 1;
  iVar6 = 1;
LAB_00152714:
  iVar14 = 1;
  iVar19 = iVar18;
  if ((int)uVar8 < 2) goto LAB_001528c6;
  do {
    uVar13 = uVar8 & 0xffffffff;
    iVar1 = (int)uVar8;
    lVar3 = (long)((iVar1 + iVar14) / 2);
    dVar20 = a[lVar3 + -1];
    if (dVar20 < a[(long)iVar14 + -1]) {
      a[lVar3 + -1] = a[(long)iVar14 + -1];
      a[(long)iVar14 + -1] = dVar20;
      dVar20 = a[lVar3 + -1];
    }
    uVar8 = (ulong)iVar1;
    iVar17 = iVar14;
    if (a[uVar8 - 1] < dVar20) {
      a[lVar3 + -1] = a[uVar8 - 1];
      a[uVar8 - 1] = dVar20;
      dVar20 = a[lVar3 + -1];
      if (dVar20 < a[(long)iVar14 + -1]) {
        a[lVar3 + -1] = a[(long)iVar14 + -1];
        a[(long)iVar14 + -1] = dVar20;
        dVar20 = a[lVar3 + -1];
      }
    }
    while( true ) {
      do {
        uVar9 = uVar8;
        dVar21 = a[uVar9 - 2];
        uVar8 = uVar9 - 1;
      } while (dVar20 < dVar21);
      lVar3 = ((long)iVar17 << 0x20) + -0x100000000;
      pdVar5 = a + iVar17;
      do {
        iVar16 = iVar17;
        pdVar12 = pdVar5;
        lVar3 = lVar3 + 0x100000000;
        iVar17 = iVar16 + 1;
        pdVar5 = pdVar12 + 1;
      } while (*pdVar12 < dVar20);
      if ((long)uVar8 <= lVar3 >> 0x20) break;
      a[uVar9 - 2] = *pdVar12;
      *pdVar12 = (double)(int)dVar21;
    }
    iu[(long)iVar18 + 0xd] = iVar6;
    indl[(long)iVar18 + 0xd] = ni;
    iVar19 = iVar18 + 1;
    iVar7 = (int)uVar8;
    iVar2 = iVar7 - iVar14;
    if (iVar1 - iVar17 < iVar2) {
      local_14c[iVar18] = iVar14;
      il[(long)iVar18 + 0xd] = iVar7;
      if (iVar6 <= ni) {
        uVar15 = -iVar6;
        piVar10 = ind + (long)iVar6 + -1;
        do {
          if (iVar16 < *piVar10) {
            iVar6 = -uVar15;
            indl[(long)iVar18 + 0xd] = ~uVar15;
            uVar8 = uVar13;
            iVar14 = iVar17;
            iVar18 = iVar19;
            iVar2 = iVar1 - iVar17;
            goto LAB_00152929;
          }
          piVar10 = piVar10 + 1;
          iVar6 = ni + uVar15;
          uVar15 = uVar15 - 1;
        } while (iVar6 != 0);
      }
    }
    else {
      local_14c[iVar18] = iVar17;
      il[(long)iVar18 + 0xd] = iVar1;
      if (iVar6 <= ni) {
        lVar3 = (long)ni + 1;
        do {
          if (ind[lVar3 + -2] < iVar7 + 1) {
            iu[(long)iVar18 + 0xd] = ni + 1;
            iVar18 = iVar19;
            goto LAB_00152929;
          }
          ni = ni + -1;
          lVar3 = lVar3 + -1;
        } while (iVar6 < lVar3);
      }
    }
LAB_001528c6:
    while( true ) {
      lVar4 = (long)iVar19;
      lVar3 = 0;
      do {
        lVar11 = lVar3;
        if (1 - lVar4 == lVar11) {
          return 0;
        }
        iVar6 = iu[lVar4 + lVar11 + 0xc];
        ni = indl[lVar4 + lVar11 + 0xc];
        lVar3 = lVar11 + -1;
      } while (ni < iVar6);
      uVar8 = (ulong)(uint)il[lVar4 + lVar11 + 0xc];
      iVar14 = local_14c[lVar4 + lVar3];
      iVar18 = iVar19 + (int)lVar3;
      iVar2 = il[lVar4 + lVar11 + 0xc] - local_14c[lVar4 + lVar3];
LAB_00152929:
      if (10 < iVar2) break;
      if (iVar14 == 1) goto LAB_00152714;
      iVar19 = iVar18;
      if (iVar14 != (int)uVar8) {
        lVar3 = (long)iVar14;
        iVar14 = iVar14 + -1;
        pdVar5 = a + lVar3;
        do {
          dVar20 = a[(long)iVar14 + 1];
          dVar21 = a[lVar3 + -1];
          pdVar12 = pdVar5;
          if (dVar20 < dVar21) {
            do {
              *pdVar12 = dVar21;
              dVar21 = pdVar12[-2];
              pdVar12 = pdVar12 + -1;
            } while (dVar20 < dVar21);
            *pdVar12 = dVar20;
          }
          iVar14 = (int)lVar3;
          lVar3 = lVar3 + 1;
          pdVar5 = pdVar5 + 1;
        } while ((int)uVar8 != (int)lVar3);
      }
    }
  } while( true );
}

Assistant:

int psort_(double *a, int n, int *ind, int ni)
{
    int i__, j, k, l, m, p;
    double t;
    int ij, il[16], jl, iu[16], ju;
    int tt;
    int indl[16], indu[16];


/* Partial Sorting ; used for Median (MAD) computation only */

/* Arg */
/* Var */
    /* Parameter adjustments */
    --a;
    --ind;

    /* Function Body */
    if (n < 0 || ni < 0) {
	return 0;
    }
    if (n < 2 || ni == 0) {
	return 0;
    }
    jl = 1;
    ju = ni;
    indl[0] = 1;
    indu[0] = ni;
    i__ = 1;
    j = n;
    m = 1;
/* Outer Loop */
L161:
    if (i__ < j) {
	goto L10;
    }
/*  _Loop_ */
L166:
    --m;
    if (m == 0) {
	return 0;
    }
    i__ = il[m - 1];
    j = iu[m - 1];
    jl = indl[m - 1];
    ju = indu[m - 1];
    if (! (jl <= ju)) {
	goto L166;
    }
/*     while (j - i > 10) */
L173:
    if (! (j - i__ > 10)) {
	goto L174;
    }
L10:
    k = i__;
    ij = (i__ + j) / 2;
    t = a[ij];
    if (a[i__] > t) {
	a[ij] = a[i__];
	a[i__] = t;
	t = a[ij];
    }
    l = j;
    if (a[j] < t) {
	a[ij] = a[j];
	a[j] = t;
	t = a[ij];
	if (a[i__] > t) {
	    a[ij] = a[i__];
	    a[i__] = t;
	    t = a[ij];
	}
    }
L181:
    --l;
    if (a[l] <= t) {
	tt = a[l];
L186:
	++k;
/* L187: */
	if (! (a[k] >= t)) {
	    goto L186;
	}
	if (k > l) {
	    goto L183;
	}
	a[l] = a[k];
	a[k] = tt;
    }
/* L182: */
    goto L181;
L183:
    indl[m - 1] = jl;
    indu[m - 1] = ju;
    p = m;
    ++m;
    if (l - i__ <= j - k) {
	il[p - 1] = k;
	iu[p - 1] = j;
	j = l;
L193:
	if (jl > ju) {
	    goto L166;
	}
	if (ind[ju] > j) {
	    --ju;
	    goto L193;
	}
	indl[p - 1] = ju + 1;
    } else {
	il[p - 1] = i__;
	iu[p - 1] = l;
	i__ = k;
L200:
	if (jl > ju) {
	    goto L166;
	}
	if (ind[jl] < i__) {
	    ++jl;
	    goto L200;
	}
	indu[p - 1] = jl - 1;
    }
    goto L173;
/*     end while */
L174:
    if (i__ != 1) {
	--i__;
L209:
	++i__;
	if (i__ == j) {
	    goto L166;
	}
	t = a[i__ + 1];
	if (a[i__] > t) {
	    k = i__;
/*           repeat */
L216:
	    a[k + 1] = a[k];
	    --k;
	    if (! (t >= a[k])) {
		goto L216;
	    }
/*           until  t >= a(k) */
	    a[k + 1] = t;
	}
	goto L209;
    }
    goto L161;
/* End Outer Loop */
}